

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O1

int Abc_CommandCS_kLiveness(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pNtk;
  Aig_Man_t *pAVar4;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *vMasterBarriers;
  Aig_Man_t *pAig;
  long lVar5;
  long lVar6;
  uint absorberCount;
  int liveIndex_0;
  timespec ts;
  int liveIndex_k;
  int local_60;
  int local_5c;
  timespec local_58;
  int local_44;
  Vec_Ptr_t *local_40;
  Aig_Man_t *local_38;
  
  local_5c = -1;
  local_44 = -1;
  pNtk = Abc_FrameReadNtk(pAbc);
  iVar2 = 0;
  if (argc != 1) {
    Extra_UtilGetoptReset();
    iVar3 = -1;
    do {
      while( true ) {
        while (iVar2 = iVar3, iVar1 = Extra_UtilGetopt(argc,argv,"cmCgh"), 0x66 < iVar1) {
          if (iVar1 == 0x67) {
            iVar3 = 4;
          }
          else {
            if (iVar1 != 0x6d) goto LAB_0058c598;
            iVar3 = 2;
          }
        }
        if (iVar1 != 0x43) break;
        iVar3 = 3;
      }
      iVar3 = 1;
    } while (iVar1 == 99);
    if (iVar1 != -1) {
LAB_0058c598:
      fwrite("usage: kcs [-cmgCh]\n",0x14,1,_stdout);
      fwrite("\timplements Claessen-Sorensson\'s k-Liveness algorithm\n",0x36,1,_stdout);
      fwrite("\t-c : verification with constraints, looks for POs prefixed with csSafetyInvar_\n",
             0x50,1,_stdout);
      fwrite("\t-m : discovers monotone signals\n",0x21,1,_stdout);
      fwrite("\t-g : verification with user-supplied barriers, looks for POs prefixed with csLevel1Stabil_\n"
             ,0x5c,1,_stdout);
      fwrite("\t-C : verification with discovered monotone signals\n",0x34,1,_stdout);
      fwrite("\t-h : print usage\n",0x12,1,_stdout);
      return 1;
    }
  }
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pAVar4 = Abc_NtkToDar(pNtk,0,1);
    pNtk_00 = pNtk;
  }
  else {
    puts("The input network was not strashed, strashing....");
    pNtk_00 = Abc_NtkStrash(pNtk,0,0,0);
    pAVar4 = Abc_NtkToDar(pNtk_00,0,1);
  }
  local_60 = -1;
  if ((iVar2 == 1) && (local_60 = collectSafetyInvariantPOIndex(pNtk_00), local_60 == -1)) {
    __assert_fail("safetyInvariantPO != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                  ,0x25c,"int Abc_CommandCS_kLiveness(Abc_Frame_t *, int, char **)");
  }
  if (iVar2 == 3) {
    local_60 = collectSafetyInvariantPOIndex(pNtk_00);
    if (local_60 == -1) {
      __assert_fail("safetyInvariantPO != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                    ,0x26c,"int Abc_CommandCS_kLiveness(Abc_Frame_t *, int, char **)");
    }
    iVar3 = clock_gettime(3,&local_58);
    if (iVar3 < 0) {
      lVar5 = 1;
    }
    else {
      lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
      lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_58.tv_sec * -1000000;
    }
    vMasterBarriers = findDisjunctiveMonotoneSignals(pNtk);
    iVar3 = clock_gettime(3,&local_58);
    if (iVar3 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    printf("pre-processing time = %f\n",(double)(lVar6 + lVar5) / 1000000.0);
    if (vMasterBarriers == (Vec_Ptr_t *)0x0) {
      __assert_fail("vMasterBarrierDisjuncts != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                    ,0x274,"int Abc_CommandCS_kLiveness(Abc_Frame_t *, int, char **)");
    }
    if (vMasterBarriers->nSize < 1) {
      __assert_fail("Vec_PtrSize(vMasterBarrierDisjuncts) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                    ,0x275,"int Abc_CommandCS_kLiveness(Abc_Frame_t *, int, char **)");
    }
  }
  else {
    if (iVar2 == 2) {
      iVar2 = clock_gettime(3,&local_58);
      if (iVar2 < 0) {
        lVar5 = 1;
      }
      else {
        lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
        lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_58.tv_sec * -1000000;
      }
      findDisjunctiveMonotoneSignals(pNtk);
      iVar2 = clock_gettime(3,&local_58);
      if (iVar2 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      printf("pre-processing time = %f\n",(double)(lVar6 + lVar5) / 1000000.0);
      return 0;
    }
    vMasterBarriers = (Vec_Ptr_t *)0x0;
  }
  if (iVar2 == 4) {
    local_60 = collectSafetyInvariantPOIndex(pNtk_00);
    if (local_60 == -1) {
      __assert_fail("safetyInvariantPO != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                    ,0x27b,"int Abc_CommandCS_kLiveness(Abc_Frame_t *, int, char **)");
    }
    iVar3 = clock_gettime(3,&local_58);
    if (iVar3 < 0) {
      lVar5 = 1;
    }
    else {
      lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
      lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_58.tv_sec * -1000000;
    }
    vMasterBarriers = collectUserGivenDisjunctiveMonotoneSignals(pNtk);
    iVar3 = clock_gettime(3,&local_58);
    if (iVar3 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    printf("pre-processing time = %f\n",(double)(lVar6 + lVar5) / 1000000.0);
    if (vMasterBarriers == (Vec_Ptr_t *)0x0) {
      __assert_fail("vMasterBarrierDisjuncts != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                    ,0x283,"int Abc_CommandCS_kLiveness(Abc_Frame_t *, int, char **)");
    }
    if (vMasterBarriers->nSize < 1) {
      __assert_fail("Vec_PtrSize(vMasterBarrierDisjuncts) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                    ,0x284,"int Abc_CommandCS_kLiveness(Abc_Frame_t *, int, char **)");
    }
  }
  local_40 = vMasterBarriers;
  local_38 = pAVar4;
  if (iVar2 - 3U < 2) {
    if (vMasterBarriers == (Vec_Ptr_t *)0x0) {
      __assert_fail("vMasterBarrierDisjuncts != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                    ,0x289,"int Abc_CommandCS_kLiveness(Abc_Frame_t *, int, char **)");
    }
    pAVar4 = generateWorkingAigWithDSC(pAVar4,pNtk,&local_5c,vMasterBarriers);
  }
  else {
    pAVar4 = generateWorkingAig(pAVar4,pNtk,&local_5c);
  }
  pAig = introduceAbsorberLogic(pAVar4,&local_5c,&local_44,0);
  Aig_ManStop(pAVar4);
  absorberCount = 1;
  do {
    pAVar4 = pAig;
    iVar3 = flipConePdr(pAig,iVar2,local_44,local_60,absorberCount);
    if (iVar3 != 0) {
      Abc_Print((int)pAVar4,"k = %d, Property proved\n",(ulong)absorberCount);
      pAVar4 = pAig;
      break;
    }
    Abc_Print((int)pAVar4,"k = %d, Property DISPROVED\n",(ulong)absorberCount);
    pAVar4 = introduceAbsorberLogic(pAig,&local_5c,&local_44,absorberCount);
    Aig_ManStop(pAig);
    absorberCount = absorberCount + 1;
    pAig = pAVar4;
  } while (absorberCount != 500);
  Aig_ManStop(pAVar4);
  Aig_ManStop(local_38);
  deallocateMasterBarrierDisjunctInt(local_40);
  return 0;
}

Assistant:

int Abc_CommandCS_kLiveness( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    	Abc_Ntk_t * pNtk, * pNtkTemp;
	Aig_Man_t * pAig, *pAigCS, *pAigCSNew;
	int absorberCount;
	int absorberLimit = 500;
	int RetValue;
	int liveIndex_0 = -1, liveIndex_k = -1;
	int fVerbose = 1;
	int directive = -1;
	int c;
	int safetyInvariantPO = -1;
	abctime beginTime, endTime;
	double time_spent;
	Vec_Ptr_t *vMasterBarrierDisjuncts = NULL;
	Aig_Man_t *pWorkingAig;
	//FILE *fp;

	pNtk = Abc_FrameReadNtk(pAbc);

	//fp = fopen("propFile.txt", "r");
	//if( fp )
	//	getVecOfVecFairness(fp);
	//exit(0);

	/*************************************************
	Extraction of Command Line Argument	
	*************************************************/
	if( argc == 1 )
	{
		assert( directive == -1 );
		directive = SIMPLE_kCS;
	}
	else
	{
		Extra_UtilGetoptReset();
		while ( ( c = Extra_UtilGetopt( argc, argv, "cmCgh" ) ) != EOF )
		{
			switch( c )
			{
			case 'c':
				directive = kCS_WITH_SAFETY_INVARIANTS; 
				break;
			case 'm':
				directive = kCS_WITH_DISCOVER_MONOTONE_SIGNALS; 
				break;
			case 'C':
				directive = kCS_WITH_SAFETY_AND_DCS_INVARIANTS;
				break;
			case 'g':
				directive = kCS_WITH_SAFETY_AND_USER_GIVEN_DCS_INVARIANTS;
				break;
			case 'h':
				goto usage;
				break;
			default:
				goto usage;
			}
		}
	}
	/*************************************************
	Extraction of Command Line Argument Ends	
	*************************************************/

	if( !Abc_NtkIsStrash( pNtk ) )
	{
		printf("The input network was not strashed, strashing....\n");
		pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );
		pAig = Abc_NtkToDar( pNtkTemp, 0, 1 );
	}
	else
	{
		pAig = Abc_NtkToDar( pNtk, 0, 1 );
		pNtkTemp = pNtk;
	}

	if( directive == kCS_WITH_SAFETY_INVARIANTS )
	{
		safetyInvariantPO = collectSafetyInvariantPOIndex(pNtkTemp);			
		assert( safetyInvariantPO != -1 );
	}

	if(directive == kCS_WITH_DISCOVER_MONOTONE_SIGNALS)
	{
		beginTime = Abc_Clock();
		vMasterBarrierDisjuncts = findDisjunctiveMonotoneSignals( pNtk );
		endTime = Abc_Clock();
		time_spent = (double)(endTime - beginTime)/CLOCKS_PER_SEC;
		printf("pre-processing time = %f\n",time_spent); 
		return 0;
	}

	if(directive == kCS_WITH_SAFETY_AND_DCS_INVARIANTS)
	{
		safetyInvariantPO = collectSafetyInvariantPOIndex(pNtkTemp);			
		assert( safetyInvariantPO != -1 );

		beginTime = Abc_Clock();
		vMasterBarrierDisjuncts = findDisjunctiveMonotoneSignals( pNtk );
		endTime = Abc_Clock();
		time_spent = (double)(endTime - beginTime)/CLOCKS_PER_SEC;
		printf("pre-processing time = %f\n",time_spent); 

		assert( vMasterBarrierDisjuncts != NULL );
		assert( Vec_PtrSize(vMasterBarrierDisjuncts) > 0 );
	}

	if(directive == kCS_WITH_SAFETY_AND_USER_GIVEN_DCS_INVARIANTS)
	{
		safetyInvariantPO = collectSafetyInvariantPOIndex(pNtkTemp);			
		assert( safetyInvariantPO != -1 );

		beginTime = Abc_Clock();
		vMasterBarrierDisjuncts = collectUserGivenDisjunctiveMonotoneSignals( pNtk );
		endTime = Abc_Clock();
		time_spent = (double)(endTime - beginTime)/CLOCKS_PER_SEC;
		printf("pre-processing time = %f\n",time_spent); 

		assert( vMasterBarrierDisjuncts != NULL );
		assert( Vec_PtrSize(vMasterBarrierDisjuncts) > 0 );
	}

	if(directive == kCS_WITH_SAFETY_AND_DCS_INVARIANTS || directive == kCS_WITH_SAFETY_AND_USER_GIVEN_DCS_INVARIANTS)
	{
		assert( vMasterBarrierDisjuncts != NULL );
		pWorkingAig = generateWorkingAigWithDSC( pAig, pNtk, &liveIndex_0, vMasterBarrierDisjuncts );
		pAigCS = introduceAbsorberLogic(pWorkingAig, &liveIndex_0, &liveIndex_k, 0);
	}
	else
	{
		pWorkingAig = generateWorkingAig( pAig, pNtk, &liveIndex_0 );
		pAigCS = introduceAbsorberLogic(pWorkingAig, &liveIndex_0, &liveIndex_k, 0);
	}

	Aig_ManStop(pWorkingAig);

	for( absorberCount=1; absorberCount<absorberLimit; absorberCount++ )
	{
		//printf( "\nindex of the liveness output = %d\n", liveIndex_k );
		RetValue = flipConePdr( pAigCS, directive, liveIndex_k, safetyInvariantPO, absorberCount );

		if ( RetValue == 1 )
		{
        		Abc_Print( 1, "k = %d, Property proved\n", absorberCount );
			break;
		}
    		else if ( RetValue == 0 )
		{
			if( fVerbose )
			{
				Abc_Print( 1, "k = %d, Property DISPROVED\n", absorberCount );
			}
		}
    		else if ( RetValue == -1 )
		{
        		Abc_Print( 1, "Property UNDECIDED with k = %d.\n", absorberCount );
		}
    		else
        		assert( 0 );

		pAigCSNew = introduceAbsorberLogic(pAigCS, &liveIndex_0, &liveIndex_k, absorberCount);
		Aig_ManStop(pAigCS);
		pAigCS = pAigCSNew;
	}

	Aig_ManStop(pAigCS);
	Aig_ManStop(pAig);

	if(directive == kCS_WITH_SAFETY_AND_USER_GIVEN_DCS_INVARIANTS)
	{
		deallocateMasterBarrierDisjunctInt(vMasterBarrierDisjuncts);
	}
	else
	{
		//if(vMasterBarrierDisjuncts)
		//	Vec_PtrFree(vMasterBarrierDisjuncts);
		//deallocateMasterBarrierDisjunctVecPtrVecInt(vMasterBarrierDisjuncts);
		deallocateMasterBarrierDisjunctInt(vMasterBarrierDisjuncts);
	}
	return 0;

	usage:
		fprintf( stdout, "usage: kcs [-cmgCh]\n" );
    		fprintf( stdout, "\timplements Claessen-Sorensson's k-Liveness algorithm\n" );
		fprintf( stdout, "\t-c : verification with constraints, looks for POs prefixed with csSafetyInvar_\n");
		fprintf( stdout, "\t-m : discovers monotone signals\n");
    		fprintf( stdout, "\t-g : verification with user-supplied barriers, looks for POs prefixed with csLevel1Stabil_\n");
		fprintf( stdout, "\t-C : verification with discovered monotone signals\n");
		fprintf( stdout, "\t-h : print usage\n");
    		return 1;

}